

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O0

void __thiscall
APhyBullet::BulletCollisionObject::setHandleCollisionFlagValue
          (BulletCollisionObject *this,CollisionFlags flag,bool value)

{
  byte in_DL;
  uint in_ESI;
  long in_RDI;
  int flags;
  undefined4 local_14;
  
  local_14 = btCollisionObject::getCollisionFlags(*(btCollisionObject **)(in_RDI + 0x10));
  if ((in_DL & 1) == 0) {
    local_14 = (in_ESI ^ 0xffffffff) & local_14;
  }
  else {
    local_14 = in_ESI | local_14;
  }
  btCollisionObject::setCollisionFlags(*(btCollisionObject **)(in_RDI + 0x10),local_14);
  return;
}

Assistant:

void BulletCollisionObject::setHandleCollisionFlagValue(btCollisionObject::CollisionFlags flag, bool value)
{
    auto flags = handle->getCollisionFlags();
    if(value)
        flags |= flag;
    else
        flags &= ~flag;
    handle->setCollisionFlags(flags);
}